

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O2

void duckdb_je_sc_data_init(sc_data_t *sc_data)

{
  _Bool _Var1;
  size_t sVar2;
  int iVar3;
  sc_t *psVar4;
  long lVar5;
  long lVar6;
  int in_R9D;
  int iVar7;
  int iVar8;
  long lVar9;
  size_t sVar10;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  int local_7c;
  int local_78;
  uint local_74;
  long local_70;
  size_t local_68;
  int local_58;
  
  psVar4 = sc_data->sc;
  lVar9 = 0;
  iVar7 = 0;
  iVar8 = 0;
  local_7c = 0;
  while (lVar9 != 1) {
    size_class(psVar4,(int)lVar9,3,3,0,in_R9D,in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
    lVar9 = lVar9 + 1;
    if (psVar4->lg_delta_lookup != 0) {
      local_7c = (int)lVar9;
    }
    iVar7 = iVar7 + (uint)psVar4->psz;
    iVar8 = iVar8 + (uint)psVar4->bin;
    psVar4 = psVar4 + 1;
  }
  size_class(sc_data->sc + 1,1,3,3,1,in_R9D,in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
  iVar8 = iVar8 + (uint)sc_data->sc[1].bin;
  local_74 = iVar7 + (uint)sc_data->sc[1].psz;
  psVar4 = sc_data->sc + 2;
  for (lVar9 = -3; lVar9 != 0; lVar9 = lVar9 + 1) {
    size_class(psVar4,(int)lVar9 + 5,4,4,(int)lVar9 + 4,in_R9D,in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff80);
    local_74 = local_74 + psVar4->psz;
    iVar8 = iVar8 + (uint)psVar4->bin;
    psVar4 = psVar4 + 1;
  }
  local_68 = 0;
  local_70 = 6;
  sVar10 = 0;
  local_78 = 0;
  sVar2 = 0;
  iVar7 = 5;
  for (lVar9 = 4; lVar9 != 0x3d; lVar9 = lVar9 + 1) {
    lVar6 = (long)iVar7;
    iVar3 = (iVar7 - (uint)(local_70 == 0x3e)) + 4;
    psVar4 = sc_data->sc + lVar6;
    for (lVar5 = 1; (lVar6 - iVar3) + lVar5 != 1; lVar5 = lVar5 + 1) {
      size_class(psVar4,iVar7,(int)local_70,(int)lVar9,(int)lVar5,in_R9D,in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff80);
      sVar2 = (lVar5 << ((byte)lVar9 & 0x3f)) + (1L << ((byte)local_70 & 0x3f));
      iVar7 = iVar7 + 1;
      if (psVar4->lg_delta_lookup != 0) {
        local_7c = iVar7;
        local_68 = sVar2;
      }
      local_74 = local_74 + psVar4->psz;
      _Var1 = psVar4->bin;
      if (_Var1 != false) {
        sVar10 = sVar2;
      }
      local_58 = (int)(local_70 + 1);
      if (_Var1 != false) {
        local_78 = local_58;
      }
      iVar8 = iVar8 + (uint)_Var1;
      psVar4 = psVar4 + 1;
    }
    local_70 = local_70 + 1;
    iVar7 = iVar3;
  }
  sc_data->ntiny = 1;
  sc_data->nlbins = local_7c;
  sc_data->nbins = iVar8;
  sc_data->nsizes = 0xe8;
  sc_data->lg_ceil_nsizes = 8;
  sc_data->npsizes = local_74;
  sc_data->lg_tiny_maxclass = 3;
  sc_data->lookup_maxclass = local_68;
  sc_data->small_maxclass = sVar10;
  sc_data->lg_large_minclass = local_78;
  sc_data->large_minclass = 1L << ((byte)local_78 & 0x3f);
  sc_data->large_maxclass = sVar2;
  sc_data->initialized = true;
  return;
}

Assistant:

void
sc_data_init(sc_data_t *sc_data) {
	size_classes(sc_data, LG_SIZEOF_PTR, LG_QUANTUM, SC_LG_TINY_MIN,
	    SC_LG_MAX_LOOKUP, LG_PAGE, SC_LG_NGROUP);

	sc_data->initialized = true;
}